

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

int prvTidytmbstrncmp(ctmbstr s1,ctmbstr s2,uint n)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  if (s2 == (ctmbstr)0x0 || s1 == (ctmbstr)0x0) {
    uVar2 = -(uint)(s1 == (ctmbstr)0x0) | 1;
    if (s1 == s2) {
      uVar2 = 0;
    }
    return uVar2;
  }
  lVar4 = 0;
  while( true ) {
    cVar1 = s1[lVar4];
    if (cVar1 != s2[lVar4]) {
      iVar3 = 0;
      if (n != (uint)lVar4) {
        iVar3 = (uint)(s2[lVar4] < cVar1) * 2 + -1;
      }
      return iVar3;
    }
    if (cVar1 == '\0') break;
    if (n == (uint)lVar4) {
      return 0;
    }
    lVar4 = lVar4 + 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrncmp)( ctmbstr s1, ctmbstr s2, uint n )
{
    uint c;

	if (s1 == NULL || s2 == NULL)
    {
        if (s1 == s2)
            return 0;
        return (s1 == NULL ? -1 : 1);
    }

    while ((c = (byte)*s1) == (byte)*s2)
    {
        if (c == '\0')
            return 0;

        if (n == 0)
            return 0;

        ++s1;
        ++s2;
        --n;
    }

    if (n == 0)
        return 0;

    return (*s1 > *s2 ? 1 : -1);
}